

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint _h;
  long lVar18;
  long lVar19;
  int kj;
  void *pvVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  void *pvVar28;
  int k;
  ulong uVar29;
  long lVar30;
  int iVar31;
  float fVar32;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_158;
  void *local_138;
  void *local_128;
  void *local_120;
  ulong local_118;
  ulong local_f8;
  void *local_f0;
  allocator_type local_d9;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  Mat local_a8;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  uVar13 = (ulong)uVar4;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      make_padding(this,bottom_blob,&local_a8,opt);
      iVar3 = local_a8.h;
      iVar2 = local_a8.w;
      iVar21 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        iVar16 = (local_a8.w - this->kernel_w) / this->stride_w;
        uVar25 = (long)(local_a8.h - this->kernel_h) / (long)this->stride_h;
        local_d0 = uVar25 & 0xffffffff;
        uVar10 = iVar16 + 1;
        _h = (int)uVar25 + 1;
        uVar25 = (ulong)_h;
        Mat::create(top_blob,uVar10,_h,uVar4,sVar5,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar27 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar27,&local_d9);
          if (0 < this->kernel_h) {
            iVar21 = this->kernel_w;
            iVar11 = 0;
            iVar15 = 0;
            iVar12 = 0;
            do {
              if (0 < this->kernel_w) {
                lVar17 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar12 + lVar17] = iVar15 + (int)lVar17;
                  lVar17 = lVar17 + 1;
                  iVar23 = (int)lVar17;
                } while (iVar23 < this->kernel_w);
                iVar12 = iVar12 + iVar23;
                iVar15 = iVar15 + iVar23;
              }
              iVar15 = iVar15 + (iVar2 - iVar21);
              iVar11 = iVar11 + 1;
            } while (iVar11 < this->kernel_h);
          }
          iVar21 = (int)uVar27;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar21 = 0;
              iVar11 = 0;
              if (this->pad_mode == 0) {
                iVar21 = (bottom_blob->w - local_a8.w) + this->pad_left + this->pad_right;
                iVar11 = (bottom_blob->h - local_a8.h) + this->pad_top + this->pad_bottom;
              }
              if (0 < (int)uVar4) {
                local_b8 = (long)(int)uVar10;
                local_b0 = local_a8.data;
                local_58 = top_blob->cstep * top_blob->elemsize;
                local_60 = top_blob->data;
                local_c8 = (long)this->stride_h;
                lVar17 = (long)local_a8.w *
                         CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                local_50 = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                           local_a8.cstep;
                local_c0 = lVar17 * local_c8;
                local_d8 = 0;
                do {
                  if (-1 < (int)local_d0) {
                    local_138 = (void *)(local_58 * local_d8 + (long)local_60);
                    iVar15 = this->stride_w;
                    uVar4 = this->kernel_h;
                    local_128 = local_b0;
                    local_f8 = 0;
                    do {
                      if (-1 < iVar16) {
                        iVar12 = this->pad_top;
                        lVar30 = 0;
                        uVar27 = 0;
                        pvVar14 = local_128;
                        do {
                          fVar32 = NAN;
                          if (0 < (int)uVar4) {
                            lVar18 = (long)((iVar11 + iVar3) - this->pad_bottom);
                            fVar32 = 0.0;
                            uVar26 = 0;
                            iVar23 = 0;
                            pvVar20 = pvVar14;
                            do {
                              lVar19 = uVar26 + local_f8 * local_c8;
                              iVar24 = 0x49;
                              if (iVar12 <= lVar19) {
                                iVar24 = 0;
                                if (lVar18 <= lVar19) {
                                  iVar24 = 0x47;
                                }
                                if (lVar19 < lVar18 && 0 < this->kernel_w) {
                                  uVar22 = 0;
                                  do {
                                    iVar31 = 0x4c;
                                    if (((long)this->pad_left <= (long)(lVar30 + uVar22)) &&
                                       (iVar31 = 0x4a,
                                       (long)(lVar30 + uVar22) <
                                       (long)((iVar21 + iVar2) - this->pad_right))) {
                                      fVar32 = fVar32 + *(float *)((long)pvVar20 + uVar22 * 4);
                                      iVar23 = iVar23 + 1;
                                      iVar31 = 0;
                                    }
                                    iVar24 = 0;
                                  } while (((iVar31 == 0x4c) || (iVar31 == 0)) &&
                                          (uVar22 = uVar22 + 1, (uint)this->kernel_w != uVar22));
                                }
                              }
                              if ((iVar24 != 0x49) && (iVar24 != 0)) break;
                              uVar26 = uVar26 + 1;
                              pvVar20 = (void *)((long)pvVar20 + lVar17);
                            } while (uVar26 != uVar4);
                            fVar32 = fVar32 / (float)iVar23;
                          }
                          *(float *)((long)local_138 + uVar27 * 4) = fVar32;
                          uVar27 = uVar27 + 1;
                          pvVar14 = (void *)((long)pvVar14 + (long)iVar15 * 4);
                          lVar30 = lVar30 + iVar15;
                        } while (uVar27 != uVar10);
                      }
                      local_138 = (void *)((long)local_138 + local_b8 * 4);
                      local_f8 = local_f8 + 1;
                      local_128 = (void *)((long)local_128 + local_c0);
                    } while (local_f8 != uVar25);
                  }
                  local_d8 = local_d8 + 1;
                  local_b0 = (void *)((long)local_b0 + local_50);
                } while (local_d8 != uVar13);
              }
            }
            else if (0 < (int)uVar4) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar14 = top_blob->data;
              local_158 = (void *)0x0;
              do {
                if (-1 < (int)local_d0) {
                  pvVar20 = (void *)(sVar5 * sVar6 * (long)local_158 + (long)pvVar14);
                  iVar2 = this->stride_h;
                  iVar3 = this->stride_w;
                  uVar26 = 0;
                  do {
                    if (-1 < iVar16) {
                      uVar22 = 0;
                      do {
                        if (iVar21 < 1) {
                          fVar32 = 0.0;
                        }
                        else {
                          fVar32 = 0.0;
                          uVar29 = 0;
                          do {
                            fVar32 = fVar32 + *(float *)((long)local_a8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar29] *
                                                  4 + uVar22 * (long)iVar3 * 4 +
                                                      uVar26 * (long)iVar2 *
                                                               (long)local_a8.w *
                                                               CONCAT44(local_a8.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_a8.elemsize) +
                                                      local_a8.cstep *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) *
                                                      (long)local_158);
                            uVar29 = uVar29 + 1;
                          } while ((uVar27 & 0xffffffff) != uVar29);
                        }
                        *(float *)((long)pvVar20 + uVar22 * 4) = fVar32 * (1.0 / (float)iVar21);
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != uVar10);
                    }
                    pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar10 * 4);
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar25);
                }
                local_158 = (void *)((long)local_158 + 1);
              } while (local_158 != (void *)uVar13);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            pvVar14 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            local_158 = (void *)0x0;
            do {
              if (-1 < (int)local_d0) {
                pvVar20 = (void *)(sVar5 * sVar6 * (long)local_158 + (long)pvVar14);
                iVar2 = this->stride_h;
                iVar3 = this->stride_w;
                uVar26 = 0;
                do {
                  if (-1 < iVar16) {
                    lVar17 = uVar26 * (long)iVar2 *
                                      (long)local_a8.w *
                                      CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize
                                              ) +
                             local_a8.cstep *
                             CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                             (long)local_158;
                    uVar22 = 0;
                    do {
                      lVar30 = uVar22 * (long)iVar3;
                      fVar32 = *(float *)((long)local_a8.data + lVar30 * 4 + lVar17);
                      if (0 < iVar21) {
                        uVar29 = 0;
                        do {
                          fVar1 = *(float *)((long)local_a8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar29] *
                                            4 + lVar30 * 4 + lVar17);
                          if (fVar32 <= fVar1) {
                            fVar32 = fVar1;
                          }
                          uVar29 = uVar29 + 1;
                        } while ((uVar27 & 0xffffffff) != uVar29);
                      }
                      *(float *)((long)pvVar20 + uVar22 * 4) = fVar32;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar10);
                  }
                  pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar10 * 4);
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              local_158 = (void *)((long)local_158 + 1);
            } while (local_158 != (void *)uVar13);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar21 = 0;
        }
      }
      piVar9 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_a8.allocator + 0x18))();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,uVar4,sVar5,opt->blob_allocator);
      iVar21 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar21 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            pvVar14 = bottom_blob->data;
            pvVar20 = top_blob->data;
            sVar5 = top_blob->cstep;
            uVar4 = this->out_w;
            iVar16 = this->out_h;
            lVar30 = bottom_blob->cstep * bottom_blob->elemsize;
            sVar6 = top_blob->elemsize;
            lVar17 = (long)iVar2 * 4;
            local_128 = (void *)0x0;
            local_120 = pvVar14;
            do {
              if (0 < iVar16) {
                local_158 = (void *)(sVar5 * sVar6 * (long)local_128 + (long)pvVar20);
                iVar21 = 0;
                do {
                  iVar11 = iVar21 + 1;
                  iVar15 = (iVar11 * iVar3 + iVar16 + -1) / iVar16;
                  if (0 < (int)uVar4) {
                    iVar21 = (iVar21 * iVar3) / iVar16;
                    uVar25 = 0;
                    do {
                      iVar12 = ((int)uVar25 * iVar2) / (int)uVar4;
                      uVar27 = uVar25 + 1;
                      iVar23 = (int)((int)uVar27 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                      fVar32 = *(float *)((long)pvVar14 +
                                         (long)(iVar12 + iVar21 * iVar2) * 4 +
                                         lVar30 * (long)local_128);
                      if (iVar21 < iVar15) {
                        lVar18 = (long)iVar21;
                        pvVar28 = (void *)(lVar17 * iVar21 + (long)local_120);
                        do {
                          lVar19 = (long)iVar12;
                          if (iVar12 < iVar23) {
                            do {
                              fVar1 = *(float *)((long)pvVar28 + lVar19 * 4);
                              if (fVar32 <= fVar1) {
                                fVar32 = fVar1;
                              }
                              lVar19 = lVar19 + 1;
                            } while (iVar23 != lVar19);
                          }
                          lVar18 = lVar18 + 1;
                          pvVar28 = (void *)((long)pvVar28 + lVar17);
                        } while (lVar18 != iVar15);
                      }
                      *(float *)((long)local_158 + uVar25 * 4) = fVar32;
                      uVar25 = uVar27;
                    } while (uVar27 != uVar4);
                  }
                  local_158 = (void *)((long)local_158 + (long)(int)uVar4 * 4);
                  iVar21 = iVar11;
                } while (iVar11 != iVar16);
              }
              local_128 = (void *)((long)local_128 + 1);
              local_120 = (void *)((long)local_120 + lVar30);
              iVar21 = 0;
            } while (local_128 != (void *)uVar13);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          local_f0 = bottom_blob->data;
          sVar5 = bottom_blob->cstep;
          pvVar14 = top_blob->data;
          sVar6 = top_blob->cstep;
          uVar4 = this->out_w;
          iVar16 = this->out_h;
          sVar7 = bottom_blob->elemsize;
          sVar8 = top_blob->elemsize;
          lVar17 = (long)iVar2 * 4;
          local_118 = 0;
          do {
            if (0 < iVar16) {
              local_158 = (void *)(sVar6 * sVar8 * local_118 + (long)pvVar14);
              iVar21 = 0;
              do {
                iVar11 = iVar21 + 1;
                iVar15 = (iVar11 * iVar3 + iVar16 + -1) / iVar16;
                if (0 < (int)uVar4) {
                  iVar21 = (iVar21 * iVar3) / iVar16;
                  uVar25 = 0;
                  do {
                    iVar23 = ((int)uVar25 * iVar2) / (int)uVar4;
                    uVar27 = uVar25 + 1;
                    iVar12 = (int)((int)uVar27 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                    fVar32 = 0.0;
                    if (iVar21 < iVar15) {
                      pvVar20 = (void *)(lVar17 * iVar21 + (long)local_f0);
                      lVar30 = (long)iVar21;
                      do {
                        lVar18 = (long)iVar23;
                        if (iVar23 < iVar12) {
                          do {
                            fVar32 = fVar32 + *(float *)((long)pvVar20 + lVar18 * 4);
                            lVar18 = lVar18 + 1;
                          } while (iVar12 != lVar18);
                        }
                        lVar30 = lVar30 + 1;
                        pvVar20 = (void *)((long)pvVar20 + lVar17);
                      } while (lVar30 != iVar15);
                    }
                    *(float *)((long)local_158 + uVar25 * 4) =
                         fVar32 / ((float)(iVar12 - iVar23) * (float)(iVar15 - iVar21));
                    uVar25 = uVar27;
                  } while (uVar27 != uVar4);
                }
                local_158 = (void *)((long)local_158 + (long)(int)uVar4 * 4);
                iVar21 = iVar11;
              } while (iVar11 != iVar16);
            }
            local_118 = local_118 + 1;
            local_f0 = (void *)((long)local_f0 + sVar5 * sVar7);
            iVar21 = 0;
          } while (local_118 != uVar13);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar5,opt->blob_allocator);
    iVar21 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar10 = iVar3 * iVar2;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar14 = bottom_blob->data;
        lVar17 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar20 = top_blob->data;
        uVar25 = 0;
        pvVar28 = pvVar14;
        do {
          fVar32 = *(float *)((long)pvVar14 + lVar17 * uVar25);
          if (0 < (int)uVar10) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar28 + uVar27 * 4);
              if (fVar32 <= fVar1) {
                fVar32 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar10 != uVar27);
          }
          *(float *)((long)pvVar20 + uVar25 * 4) = fVar32;
          uVar25 = uVar25 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar17);
        } while (uVar25 != uVar13);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar14 = bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        pvVar20 = top_blob->data;
        sVar6 = bottom_blob->elemsize;
        uVar25 = 0;
        do {
          if ((int)uVar10 < 1) {
            fVar32 = 0.0;
          }
          else {
            fVar32 = 0.0;
            uVar27 = 0;
            do {
              fVar32 = fVar32 + *(float *)((long)pvVar14 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar10 != uVar27);
          }
          *(float *)((long)pvVar20 + uVar25 * 4) = fVar32 * (1.0 / (float)(int)uVar10);
          uVar25 = uVar25 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
        } while (uVar25 != uVar13);
      }
      iVar21 = 0;
    }
  }
  return iVar21;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}